

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall google::protobuf::compiler::Version::InternalSwap(Version *this,Version *other)

{
  undefined1 uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long __tmp;
  
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar6 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar6 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  uVar4 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar8 = uVar4;
  if ((uVar4 & 1) != 0) {
    uVar8 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
  }
  if (uVar6 == uVar8) {
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar4;
    (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar3;
    uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar2;
    pvVar5 = (other->field_0)._impl_.suffix_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.suffix_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.suffix_.tagged_ptr_.ptr_;
    (this->field_0)._impl_.suffix_.tagged_ptr_.ptr_ = pvVar5;
    lVar7 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&this->field_0 + lVar7 + 0x10);
      *(undefined1 *)((long)&this->field_0 + lVar7 + 0x10) =
           *(undefined1 *)((long)&other->field_0 + lVar7 + 0x10);
      *(undefined1 *)((long)&other->field_0 + lVar7 + 0x10) = uVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xc);
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }